

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O1

void __thiscall
nigel::BuilderTask::printErrorLog
          (BuilderTask *this,
          list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
          *notificationList,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          startTime)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  mapped_type *pmVar7;
  ulong *puVar8;
  ulong uVar9;
  double *pdVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  double dVar13;
  undefined8 uVar14;
  char cVar15;
  _Alloc_hider _Var16;
  size_t i;
  ulong uVar17;
  bool bVar18;
  double dVar19;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  string __str;
  string __str_1;
  string __str_3;
  string __str_5;
  string __str_2;
  String outStr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  ulong local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  ulong *local_208;
  long local_200;
  ulong local_1f8;
  undefined8 uStack_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  undefined4 local_1bc;
  ulong local_1b8;
  ulong *local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  ulong local_1a0 [2];
  double *local_190;
  long local_188;
  double local_180;
  undefined8 uStack_178;
  double *local_170;
  long local_168;
  double local_160;
  long lStack_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  uint local_108;
  undefined4 uStack_104;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  double local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  undefined8 local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ulong local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_80;
  _List_node_base *local_78;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  lVar4 = std::chrono::_V2::system_clock::now();
  local_d0 = (double)(lVar4 - (long)startTime.__d.__r) / 1000000000.0;
  local_80 = &this->notificationTexts;
  local_1bc = 1;
  local_1b8 = 0;
  local_1c8 = 0;
  local_a8 = 0;
  local_78 = (_List_node_base *)notificationList;
  while (uVar17 = local_a8,
        notificationList =
             (list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
              *)(((_List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                   *)&((_List_node_base *)notificationList)->_M_next)->_M_impl)._M_node.
                super__List_node_base._M_next, (_List_node_base *)notificationList != local_78) {
    plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 8);
    lVar4 = *plVar5;
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char*>((string *)&local_268,lVar4,plVar5[1] + lVar4);
    std::__cxx11::string::append((char *)&local_268);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_268);
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258._M_allocated_capacity + 1);
    }
    if (*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28) == 0)
    {
      if (*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x38) !=
          -1) {
        uVar17 = *(ulong *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next +
                           0x38);
        cVar15 = '\x01';
        if (9 < uVar17) {
          uVar9 = uVar17;
          cVar2 = '\x04';
          do {
            cVar15 = cVar2;
            if (uVar9 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_001419af;
            }
            if (uVar9 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_001419af;
            }
            if (uVar9 < 10000) goto LAB_001419af;
            bVar18 = 99999 < uVar9;
            uVar9 = uVar9 / 10000;
            cVar2 = cVar15 + '\x04';
          } while (bVar18);
          cVar15 = cVar15 + '\x01';
        }
LAB_001419af:
        local_268 = &local_258;
        std::__cxx11::string::_M_construct((ulong)&local_268,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_268->_M_local_buf,(uint)local_260,uVar17);
        std::__cxx11::string::_M_append((char *)local_70,(ulong)local_268);
        uVar14 = local_258._M_allocated_capacity;
        _Var16._M_p = (pointer)local_268;
        if (local_268 != &local_258) goto LAB_001419ee;
      }
    }
    else {
      uVar17 = *(ulong *)(*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->
                                          _M_next + 0x28) + 0x20);
      cVar15 = '\x01';
      if (9 < uVar17) {
        uVar9 = uVar17;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar9 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_00141776;
          }
          if (uVar9 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_00141776;
          }
          if (uVar9 < 10000) goto LAB_00141776;
          bVar18 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar18);
        cVar15 = cVar15 + '\x01';
      }
LAB_00141776:
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_228,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_228._M_dataplus._M_p,(uint)local_228._M_string_length,uVar17);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_248 = &local_238;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_238 = *puVar8;
        lStack_230 = plVar5[3];
      }
      else {
        local_238 = *puVar8;
        local_248 = (ulong *)*plVar5;
      }
      local_240 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      uVar17 = *(ulong *)(*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->
                                          _M_next + 0x28) + 0x28);
      cVar15 = '\x01';
      if (9 < uVar17) {
        uVar9 = uVar17;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar9 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_00141860;
          }
          if (uVar9 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_00141860;
          }
          if (uVar9 < 10000) goto LAB_00141860;
          bVar18 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar18);
        cVar15 = cVar15 + '\x01';
      }
LAB_00141860:
      local_208 = &local_1f8;
      std::__cxx11::string::_M_construct((ulong)&local_208,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_208,(uint)local_200,uVar17);
      uVar17 = 0xf;
      if (local_248 != &local_238) {
        uVar17 = local_238;
      }
      if (uVar17 < (ulong)(local_200 + local_240)) {
        uVar17 = 0xf;
        if (local_208 != &local_1f8) {
          uVar17 = local_1f8;
        }
        if (uVar17 < (ulong)(local_200 + local_240)) goto LAB_001418d0;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_248);
      }
      else {
LAB_001418d0:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_208);
      }
      pdVar10 = (double *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pdVar10) {
        local_258._M_allocated_capacity = (size_type)*pdVar10;
        local_258._8_8_ = puVar6[3];
        local_268 = &local_258;
      }
      else {
        local_258._M_allocated_capacity = (size_type)*pdVar10;
        local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_260 = puVar6[1];
      *puVar6 = pdVar10;
      puVar6[1] = 0;
      *(undefined1 *)pdVar10 = 0;
      std::__cxx11::string::_M_append((char *)local_70,(ulong)local_268);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258._M_allocated_capacity + 1);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      uVar14 = local_228.field_2._M_allocated_capacity;
      _Var16._M_p = local_228._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
LAB_001419ee:
        operator_delete(_Var16._M_p,uVar14 + 1);
      }
    }
    std::__cxx11::string::append((char *)local_70);
    uVar1 = *(uint *)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    if (uVar1 - 1 < 0x7ffe) {
      std::__cxx11::string::append((char *)local_70);
      local_a8 = local_a8 + 1;
      local_1bc = 3;
    }
    else if (uVar1 - 0x8000 < 0x7fff) {
      std::__cxx11::string::append((char *)local_70);
      local_1c8 = local_1c8 + 1;
      local_1bc = 2;
    }
    else if ((uVar1 & 0xfffffffe) == 0x10000) {
      std::__cxx11::string::append((char *)local_70);
      local_1b8 = local_1b8 + 1;
      local_1bc = 1;
    }
    uVar17 = (ulong)*(int *)((_List_node_base *)((long)notificationList + 0x10))->_M_next;
    cVar15 = '\x01';
    if (9 < uVar17) {
      uVar9 = uVar17;
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar9 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00141afb;
        }
        if (uVar9 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00141afb;
        }
        if (uVar9 < 10000) goto LAB_00141afb;
        bVar18 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar18);
      cVar15 = cVar15 + '\x01';
    }
LAB_00141afb:
    local_1e8 = &local_1d8;
    std::__cxx11::string::_M_construct((ulong)&local_1e8,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_1e8,(uint)local_1e0,uVar17);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,0x1741c6);
    local_208 = &local_1f8;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_1f8 = *puVar8;
      uStack_1f0 = puVar6[3];
    }
    else {
      local_1f8 = *puVar8;
      local_208 = (ulong *)*puVar6;
    }
    local_200 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    pdVar10 = (double *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pdVar10) {
      local_228.field_2._M_allocated_capacity = (size_type)*pdVar10;
      local_228.field_2._8_8_ = puVar6[3];
    }
    else {
      local_228.field_2._M_allocated_capacity = (size_type)*pdVar10;
      local_228._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_228._M_string_length = puVar6[1];
    *puVar6 = pdVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    pmVar7 = std::
             map<nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<nigel::CompileNotification::Type>,_std::allocator<std::pair<const_nigel::CompileNotification::Type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_80,(key_type *)
                                   ((_List_node_base *)((long)notificationList + 0x10))->_M_next);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_228,(ulong)(pmVar7->_M_dataplus)._M_p);
    local_248 = &local_238;
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_238 = *puVar8;
      lStack_230 = plVar5[3];
    }
    else {
      local_238 = *puVar8;
      local_248 = (ulong *)*plVar5;
    }
    local_240 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar11) {
      local_258._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_258._8_8_ = plVar5[3];
      local_268 = &local_258;
    }
    else {
      local_258._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5;
    }
    local_260 = plVar5[1];
    *plVar5 = (long)paVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    dVar19 = (double)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_268);
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258._M_allocated_capacity + 1);
      dVar19 = extraout_XMM0_Qa;
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
      dVar19 = extraout_XMM0_Qa_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      dVar19 = extraout_XMM0_Qa_01;
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
      dVar19 = extraout_XMM0_Qa_02;
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
      dVar19 = extraout_XMM0_Qa_03;
    }
    if (*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28) != 0)
    {
      plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28
                         );
      (**(code **)(*plVar5 + 0x10))(&local_228,plVar5,0);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x1754ce);
      local_248 = &local_238;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_238 = *puVar8;
        lStack_230 = plVar5[3];
      }
      else {
        local_238 = *puVar8;
        local_248 = (ulong *)*plVar5;
      }
      local_240 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar11) {
        local_258._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_258._8_8_ = plVar5[3];
        local_268 = &local_258;
      }
      else {
        local_258._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5;
      }
      local_260 = plVar5[1];
      *plVar5 = (long)paVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      dVar19 = (double)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_268);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258._M_allocated_capacity + 1);
        dVar19 = extraout_XMM0_Qa_04;
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
        dVar19 = extraout_XMM0_Qa_05;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        dVar19 = extraout_XMM0_Qa_06;
      }
    }
    if (*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x18) != 0)
    {
      std::__cxx11::string::append((char *)local_70);
      dVar19 = (double)std::__cxx11::string::_M_append
                                 ((char *)local_70,
                                  **(ulong **)
                                    ((long)((_List_node_base *)((long)notificationList + 0x10))->
                                           _M_next + 0x18));
    }
    lVar4 = *(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28);
    if (lVar4 != 0) {
      uVar17 = *(ulong *)(lVar4 + 0x28);
      plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28
                         );
      (**(code **)(*plVar5 + 0x10))(&local_268,plVar5,0);
      iVar3 = std::__cxx11::string::compare((char *)&local_268);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        uVar17 = *(long *)(*(long *)((long)((_List_node_base *)((long)notificationList + 0x10))->
                                           _M_next + 0x18) + 8) + 1;
      }
      cVar15 = (char)(string *)local_70;
      if (1 < uVar17) {
        lVar4 = uVar17 - 1;
        do {
          std::__cxx11::string::push_back(cVar15);
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      std::__cxx11::string::push_back(cVar15);
      plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next + 0x28
                         );
      (**(code **)(*plVar5 + 0x10))(&local_268,plVar5,0);
      iVar3 = std::__cxx11::string::compare((char *)&local_268);
      if (iVar3 == 0) {
        bVar18 = false;
        dVar19 = extraout_XMM0_Qa_07;
      }
      else {
        plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next +
                           0x28);
        (**(code **)(*plVar5 + 0x10))(local_50,plVar5,0);
        iVar3 = std::__cxx11::string::compare((char *)local_50);
        bVar18 = iVar3 != 0;
        dVar19 = extraout_XMM0_Qa_08;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
          dVar19 = extraout_XMM0_Qa_09;
        }
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258._M_allocated_capacity + 1);
        dVar19 = extraout_XMM0_Qa_10;
      }
      if (bVar18) {
        uVar17 = 1;
        while( true ) {
          plVar5 = *(long **)((long)((_List_node_base *)((long)notificationList + 0x10))->_M_next +
                             0x28);
          dVar19 = (double)(**(code **)(*plVar5 + 0x10))(&local_268,plVar5,0);
          uVar9 = local_260;
          if (local_268 != &local_258) {
            operator_delete(local_268,local_258._M_allocated_capacity + 1);
            dVar19 = extraout_XMM0_Qa_11;
          }
          if (uVar9 <= uVar17) break;
          std::__cxx11::string::push_back(cVar15);
          uVar17 = uVar17 + 1;
        }
      }
    }
    helper::log((helper *)local_70,dVar19);
  }
  if (local_a8 == 0) {
    if (local_1c8 == 0 && local_1b8 == 0) {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_228,vsnprintf,0x148,"%f",local_d0);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x17559b)
      ;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_238 = *puVar8;
        lStack_230 = puVar6[3];
        local_248 = &local_238;
      }
      else {
        local_238 = *puVar8;
        local_248 = (ulong *)*puVar6;
      }
      local_240 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar11) {
        dVar19 = (double)paVar11->_M_allocated_capacity;
        local_258._8_8_ = plVar5[3];
        local_268 = &local_258;
        local_258._M_allocated_capacity = (size_type)dVar19;
      }
      else {
        dVar19 = extraout_XMM0_Qa_13;
        local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5;
        local_258._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_260 = plVar5[1];
      *plVar5 = (long)paVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      helper::log((helper *)&local_268,dVar19);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258._M_allocated_capacity + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      local_100._M_allocated_capacity = local_228.field_2._M_allocated_capacity;
      _Var16._M_p = local_228._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p == &local_228.field_2) goto LAB_001432bc;
    }
    else {
      local_110 = &local_100;
      std::__cxx11::string::_M_construct((ulong)&local_110,'\x01');
      local_110->_M_local_buf[0] = '0';
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x175545)
      ;
      pdVar10 = (double *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pdVar10) {
        local_b8._M_allocated_capacity = (size_type)*pdVar10;
        local_b8._8_8_ = puVar6[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8._M_allocated_capacity = (size_type)*pdVar10;
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
      }
      local_c0 = puVar6[1];
      *puVar6 = pdVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_e0 = *puVar8;
        lStack_d8 = plVar5[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *puVar8;
        local_f0 = (ulong *)*plVar5;
      }
      local_e8 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      cVar15 = '\x01';
      if (9 < local_1c8) {
        uVar17 = local_1c8;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar17 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_00142b9e;
          }
          if (uVar17 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_00142b9e;
          }
          if (uVar17 < 10000) goto LAB_00142b9e;
          bVar18 = 99999 < uVar17;
          uVar17 = uVar17 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar18);
        cVar15 = cVar15 + '\x01';
      }
LAB_00142b9e:
      local_1b0 = local_1a0;
      std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b0,local_1a8,local_1c8);
      uVar17 = CONCAT44(uStack_1a4,local_1a8) + local_e8;
      uVar9 = 0xf;
      if (local_f0 != &local_e0) {
        uVar9 = local_e0;
      }
      if (uVar9 < uVar17) {
        uVar9 = 0xf;
        if (local_1b0 != local_1a0) {
          uVar9 = local_1a0[0];
        }
        if (uVar9 < uVar17) goto LAB_00142c26;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_f0);
      }
      else {
LAB_00142c26:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_1b0);
      }
      local_130 = &local_120;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_120 = *plVar5;
        uStack_118 = puVar6[3];
      }
      else {
        local_120 = *plVar5;
        local_130 = (long *)*puVar6;
      }
      local_128 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
      local_170 = &local_160;
      pdVar10 = (double *)(plVar5 + 2);
      if ((double *)*plVar5 == pdVar10) {
        local_160 = *pdVar10;
        lStack_158 = plVar5[3];
      }
      else {
        local_160 = *pdVar10;
        local_170 = (double *)*plVar5;
      }
      local_168 = plVar5[1];
      *plVar5 = (long)pdVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
      pdVar10 = (double *)(puVar6 + 2);
      if ((double *)*puVar6 == pdVar10) {
        local_180 = *pdVar10;
        uStack_178 = puVar6[3];
        local_190 = &local_180;
      }
      else {
        local_180 = *pdVar10;
        local_190 = (double *)*puVar6;
      }
      local_188 = puVar6[1];
      *puVar6 = pdVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      cVar15 = '\x01';
      if (9 < local_1b8) {
        uVar17 = local_1b8;
        cVar2 = '\x04';
        do {
          cVar15 = cVar2;
          if (uVar17 < 100) {
            cVar15 = cVar15 + -2;
            goto LAB_00142de8;
          }
          if (uVar17 < 1000) {
            cVar15 = cVar15 + -1;
            goto LAB_00142de8;
          }
          if (uVar17 < 10000) goto LAB_00142de8;
          bVar18 = 99999 < uVar17;
          uVar17 = uVar17 / 10000;
          cVar2 = cVar15 + '\x04';
        } while (bVar18);
        cVar15 = cVar15 + '\x01';
      }
LAB_00142de8:
      paVar11 = &local_150.field_2;
      local_150._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct((ulong)&local_150,cVar15);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,local_1b8);
      dVar19 = (double)(CONCAT44(local_150._M_string_length._4_4_,(uint)local_150._M_string_length)
                       + local_188);
      dVar13 = 7.4109846876187e-323;
      if (local_190 != &local_180) {
        dVar13 = local_180;
      }
      if ((ulong)dVar13 < (ulong)dVar19) {
        uVar14 = 7.4109846876187e-323;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != paVar11) {
          uVar14 = local_150.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < (ulong)dVar19) goto LAB_00142e70;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_190);
      }
      else {
LAB_00142e70:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_190,(ulong)local_150._M_dataplus._M_p);
      }
      local_1e8 = &local_1d8;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_1d8 = *puVar8;
        uStack_1d0 = puVar6[3];
      }
      else {
        local_1d8 = *puVar8;
        local_1e8 = (ulong *)*puVar6;
      }
      local_1e0 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)puVar8 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
      local_208 = &local_1f8;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_1f8 = *puVar8;
        uStack_1f0 = puVar6[3];
      }
      else {
        local_1f8 = *puVar8;
        local_208 = (ulong *)*puVar6;
      }
      local_200 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      pdVar10 = (double *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pdVar10) {
        local_228.field_2._M_allocated_capacity = (size_type)*pdVar10;
        local_228.field_2._8_8_ = puVar6[3];
      }
      else {
        local_228.field_2._M_allocated_capacity = (size_type)*pdVar10;
        local_228._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_228._M_string_length = puVar6[1];
      *puVar6 = pdVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_a0,vsnprintf,0x148,"%f",local_d0);
      uVar14 = 7.4109846876187e-323;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar14 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_a0._M_string_length + local_228._M_string_length) {
        uVar14 = 7.4109846876187e-323;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          uVar14 = local_a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_a0._M_string_length + local_228._M_string_length)
        goto LAB_00143033;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_a0,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
      }
      else {
LAB_00143033:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_228,(ulong)local_a0._M_dataplus._M_p);
      }
      local_248 = &local_238;
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_238 = *puVar8;
        lStack_230 = puVar6[3];
      }
      else {
        local_238 = *puVar8;
        local_248 = (ulong *)*puVar6;
      }
      local_240 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)puVar8 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_268 = &local_258;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar12) {
        dVar19 = (double)paVar12->_M_allocated_capacity;
        local_258._8_8_ = plVar5[3];
        local_258._M_allocated_capacity = (size_type)dVar19;
      }
      else {
        dVar19 = extraout_XMM0_Qa_14;
        local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5;
        local_258._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_260 = plVar5[1];
      *plVar5 = (long)paVar12;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      helper::log((helper *)&local_268,dVar19);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258._M_allocated_capacity + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar11) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if (local_190 != &local_180) {
        operator_delete(local_190,(long)local_180 + 1);
      }
      if (local_170 != &local_160) {
        operator_delete(local_170,(long)local_160 + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if (local_1b0 != local_1a0) {
        operator_delete(local_1b0,local_1a0[0] + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8._M_allocated_capacity + 1);
      }
      _Var16._M_p = (pointer)local_110;
      if (local_110 == &local_100) goto LAB_001432bc;
    }
  }
  else {
    cVar15 = '\x01';
    if (9 < local_a8) {
      uVar9 = local_a8;
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar9 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_001421ed;
        }
        if (uVar9 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_001421ed;
        }
        if (uVar9 < 10000) goto LAB_001421ed;
        bVar18 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar18);
      cVar15 = cVar15 + '\x01';
    }
LAB_001421ed:
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_c8->_M_local_buf,(uint)local_c0,uVar17);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x1754e6);
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_e0 = *puVar8;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar8;
      local_f0 = (ulong *)*plVar5;
    }
    local_e8 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_120 = *plVar5;
      uStack_118 = puVar6[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar5;
      local_130 = (long *)*puVar6;
    }
    local_128 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
    pdVar10 = (double *)(plVar5 + 2);
    if ((double *)*plVar5 == pdVar10) {
      local_160 = *pdVar10;
      lStack_158 = plVar5[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *pdVar10;
      local_170 = (double *)*plVar5;
    }
    local_168 = plVar5[1];
    *plVar5 = (long)pdVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cVar15 = '\x01';
    if (9 < local_1c8) {
      uVar17 = local_1c8;
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar17 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_001423c8;
        }
        if (uVar17 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_001423c8;
        }
        if (uVar17 < 10000) goto LAB_001423c8;
        bVar18 = 99999 < uVar17;
        uVar17 = uVar17 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar18);
      cVar15 = cVar15 + '\x01';
    }
LAB_001423c8:
    local_110 = &local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_110->_M_local_buf,local_108,local_1c8);
    dVar19 = (double)(CONCAT44(uStack_104,local_108) + local_168);
    dVar13 = 7.4109846876187e-323;
    if (local_170 != &local_160) {
      dVar13 = local_160;
    }
    if ((ulong)dVar13 < (ulong)dVar19) {
      uVar14 = 7.4109846876187e-323;
      if (local_110 != &local_100) {
        uVar14 = local_100._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (ulong)dVar19) goto LAB_00142450;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_170);
    }
    else {
LAB_00142450:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_110);
    }
    local_190 = &local_180;
    pdVar10 = (double *)(puVar6 + 2);
    if ((double *)*puVar6 == pdVar10) {
      local_180 = *pdVar10;
      uStack_178 = puVar6[3];
    }
    else {
      local_180 = *pdVar10;
      local_190 = (double *)*puVar6;
    }
    local_188 = puVar6[1];
    *puVar6 = pdVar10;
    puVar6[1] = 0;
    *(undefined1 *)pdVar10 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
    local_1e8 = &local_1d8;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_1d8 = *puVar8;
      uStack_1d0 = puVar6[3];
    }
    else {
      local_1d8 = *puVar8;
      local_1e8 = (ulong *)*puVar6;
    }
    local_1e0 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    cVar15 = '\x01';
    if (9 < local_1b8) {
      uVar17 = local_1b8;
      cVar2 = '\x04';
      do {
        cVar15 = cVar2;
        if (uVar17 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0014259c;
        }
        if (uVar17 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0014259c;
        }
        if (uVar17 < 10000) goto LAB_0014259c;
        bVar18 = 99999 < uVar17;
        uVar17 = uVar17 / 10000;
        cVar2 = cVar15 + '\x04';
      } while (bVar18);
      cVar15 = cVar15 + '\x01';
    }
LAB_0014259c:
    local_1b0 = local_1a0;
    std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b0,local_1a8,local_1b8);
    uVar17 = CONCAT44(uStack_1a4,local_1a8) + local_1e0;
    uVar9 = 0xf;
    if (local_1e8 != &local_1d8) {
      uVar9 = local_1d8;
    }
    if (uVar9 < uVar17) {
      uVar9 = 0xf;
      if (local_1b0 != local_1a0) {
        uVar9 = local_1a0[0];
      }
      if (uVar9 < uVar17) goto LAB_0014262c;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1e8);
    }
    else {
LAB_0014262c:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_1b0);
    }
    local_208 = &local_1f8;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_1f8 = *puVar8;
      uStack_1f0 = puVar6[3];
    }
    else {
      local_1f8 = *puVar8;
      local_208 = (ulong *)*puVar6;
    }
    local_200 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    pdVar10 = (double *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pdVar10) {
      local_228.field_2._M_allocated_capacity = (size_type)*pdVar10;
      local_228.field_2._8_8_ = puVar6[3];
    }
    else {
      local_228.field_2._M_allocated_capacity = (size_type)*pdVar10;
      local_228._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_228._M_string_length = puVar6[1];
    *puVar6 = pdVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_150,vsnprintf,0x148,"%f",local_d0);
    dVar19 = (double)(CONCAT44(local_150._M_string_length._4_4_,(uint)local_150._M_string_length) +
                     local_228._M_string_length);
    uVar14 = 7.4109846876187e-323;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar14 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (ulong)dVar19) {
      uVar14 = 7.4109846876187e-323;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        uVar14 = local_150.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (ulong)dVar19) goto LAB_00142771;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_150,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
    }
    else {
LAB_00142771:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_150._M_dataplus._M_p)
      ;
    }
    local_248 = &local_238;
    puVar8 = puVar6 + 2;
    if ((ulong *)*puVar6 == puVar8) {
      local_238 = *puVar8;
      lStack_230 = puVar6[3];
    }
    else {
      local_238 = *puVar8;
      local_248 = (ulong *)*puVar6;
    }
    local_240 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_268 = &local_258;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar11) {
      dVar19 = (double)paVar11->_M_allocated_capacity;
      local_258._8_8_ = plVar5[3];
      local_258._M_allocated_capacity = (size_type)dVar19;
    }
    else {
      dVar19 = extraout_XMM0_Qa_12;
      local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5;
      local_258._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_260 = plVar5[1];
    *plVar5 = (long)paVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    helper::log((helper *)&local_268,dVar19);
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258._M_allocated_capacity + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0,local_1a0[0] + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,(long)local_180 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100._M_allocated_capacity + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,(long)local_160 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    local_100._M_allocated_capacity = local_b8._M_allocated_capacity;
    _Var16._M_p = (pointer)local_c8;
    if (local_c8 == &local_b8) goto LAB_001432bc;
  }
  operator_delete(_Var16._M_p,local_100._M_allocated_capacity + 1);
LAB_001432bc:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void BuilderTask::printErrorLog( std::list<std::shared_ptr<CompileNotification>> notificationList, std::chrono::time_point<std::chrono::system_clock> startTime )
	{
		size_t errorCount = 0, warningCount = 0, notificationCount = 0;
		String outStr = "";
		LogLevel level = LogLevel::Information;

		std::chrono::time_point<std::chrono::system_clock> endTime = std::chrono::system_clock::now();
		std::chrono::duration<double> duration = ( endTime - startTime );

		for( auto &n : notificationList )
		{
			outStr = n->file->generic_string() + "(";
			if( n->token != nullptr ) outStr += to_string( n->token->lineNo ) + ", " + to_string( n->token->columnNo );
			else if( n->line != -1 ) outStr += to_string( n->line );
			outStr += "): ";

			if( n->type > NT::begin_err && n->type < NT::begin_warning )
			{//error
				outStr += "error";
				level = LogLevel::Error;
				errorCount++;
			}
			else if( n->type > NT::begin_warning && n->type < NT::begin_improvements )
			{//warning
				outStr += "warning";
				level = LogLevel::Warning;
				warningCount++;
			}
			else if( n->type > NT::begin_improvements && n->type < NT::count )
			{//notification
				outStr += "notification";
				level = LogLevel::Information;
				notificationCount++;
			}

			outStr += " " + to_string( n->getCode() ) + " \"" + notificationTexts[n->type] + "\"" ;
			if( n->token != nullptr ) outStr += " at token '" + n->token->toString() + "'";
			if( n->lineText != nullptr )
			{
				outStr += ": \n";
				outStr += *n->lineText;
			}

			if( n->token != nullptr )
			{
				size_t pos = n->token->columnNo;
				if( n->token->toString() == "_!EOF!_" ) pos = n->lineText->size() + 1;

				for( size_t i = 1 ; i < pos ; i++ ) outStr += ' ';

				outStr += '^';
				if( n->token->toString() != "-!-UNKNOWN-!-" &&
					n->token->toString() != "_!EOF!_" ) 
					for( size_t i = 1 ; i < n->token->toString().size() ; i++ ) outStr += '~';
			}

			log( outStr, level );
		}
		if( errorCount > 0 )
		{
			log( "FAILED " + to_string( errorCount ) + ( errorCount > 1 ? " ERRORS" : " ERROR" ) + " OCCURRED! " + to_string( warningCount ) + " warnings occurred. " + to_string( notificationCount ) + " improvements available. Took " + to_string( duration.count() ) + " second" );
		}
		else if( warningCount > 0 || notificationCount > 0 )
		{
			log( "Finshed with " + to_string( errorCount ) + " errors, " + to_string( warningCount ) + ( warningCount == 1 ? " warning" : " warnings" ) + " and " + to_string( notificationCount ) + ( warningCount == 1 ? " improvement" : " improvements" ) + " in " + to_string( duration.count() ) + " seconds." );
		}
		else log( "Successfully finished in " + to_string( duration.count() ) + " seconds. " );
	}